

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

void __thiscall GlobOpt::UpdateObjPtrValueType(GlobOpt *this,Opnd *opnd,Instr *instr)

{
  Sym *this_00;
  EquivalentTypeSet *this_01;
  Loop *loop;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  ValueType VVar4;
  TypeId TVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  PropertySymOpnd *this_02;
  StackSym *pSVar8;
  Value *value;
  Value *pVVar9;
  JsTypeValueInfo *pJVar10;
  JITType *pJVar11;
  JITTypeHandler *pJVar12;
  uint16 index;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder type;
  ValueType newValueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType objValueType;
  
  OVar2 = IR::Opnd::GetKind(opnd);
  if (OVar2 == OpndKindSym) {
    OVar2 = IR::Opnd::GetKind(opnd);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_004a50f8;
      *puVar7 = 0;
    }
    bVar3 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)opnd);
    if (!bVar3) {
      return;
    }
    bVar3 = IR::Instr::HasTypeCheckBailOut(instr);
    if (!bVar3) {
      return;
    }
    if ((instr->m_opcode != CheckFixedFld) && (this->prePassLoop != (Loop *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x80e,
                         "(instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass())",
                         "instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass()");
      if (!bVar3) goto LAB_004a50f8;
      *puVar7 = 0;
    }
    if (instr->m_opcode != CheckFixedFld) {
      return;
    }
    this_02 = IR::Opnd::AsPropertySymOpnd(opnd);
    pSVar8 = IR::PropertySymOpnd::GetObjectSym(this_02);
    value = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar8->super_Sym);
    if (value == (Value *)0x0) {
      return;
    }
    local_32[0] = (value->valueInfo->super_ValueType).field_0;
    bVar3 = ValueType::IsDefinite((ValueType *)&local_32[0].field_0);
    if (bVar3) {
      return;
    }
    this_00 = value->valueInfo->symStore;
    if (((this_00 != (Sym *)0x0) && (this_00->m_kind == SymKindStack)) &&
       (pSVar8 = Sym::AsStackSym(this_00), (pSVar8->field_0x1a & 4) != 0)) {
      return;
    }
    bVar3 = IR::PropertySymOpnd::HasObjectTypeSym(this_02);
    if (!bVar3) {
      return;
    }
    pSVar8 = IR::PropertySymOpnd::GetObjectTypeSym(this_02);
    if (pSVar8 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x836,"(typeSym)","typeSym");
      if (!bVar3) goto LAB_004a50f8;
      *puVar7 = 0;
    }
    pVVar9 = GlobOptBlockData::FindObjectTypeValue(&this->currentBlock->globOptData,pSVar8);
    if (pVVar9 == (Value *)0x0) {
      return;
    }
    pJVar10 = ValueInfo::AsJsType(pVVar9->valueInfo);
    local_48.t = (pJVar10->jsType).t;
    type.t = (Type)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_48,&type.t);
    if (bVar3) {
      pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
      TVar5 = JITType::GetTypeId(pJVar11);
      bVar3 = Js::DynamicType::Is(TVar5);
      if (bVar3) {
        pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
        pJVar12 = JITType::GetTypeHandler(pJVar11);
        bVar3 = JITTypeHandler::IsLocked(pJVar12);
        if (!bVar3) {
          return;
        }
      }
    }
    else {
      this_01 = pJVar10->jsTypeSet;
      if (this_01 == (EquivalentTypeSet *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x849,"(typeSet)","typeSet");
        if (!bVar3) goto LAB_004a50f8;
        *puVar7 = 0;
      }
      if (this_01->count != 0) {
        index = 0;
        do {
          local_48.t = (Type)Js::EquivalentTypeSet::GetType(this_01,index);
          pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
          TVar5 = JITType::GetTypeId(pJVar11);
          bVar3 = Js::DynamicType::Is(TVar5);
          if (bVar3) {
            pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
            pJVar12 = JITType::GetTypeHandler(pJVar11);
            bVar3 = JITTypeHandler::IsLocked(pJVar12);
            if (!bVar3) {
              return;
            }
          }
          index = index + 1;
        } while (index < this_01->count);
      }
    }
    type.t = (Type)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_48,&type.t);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x855,"(type != nullptr)","type != nullptr");
      if (!bVar3) {
LAB_004a50f8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
    TVar5 = JITType::GetTypeId(pJVar11);
    BVar6 = Js::TypedArrayBase::Is(TVar5);
    if (BVar6 == 0) {
      VVar4 = ValueType::FromTypeId(TVar5,false);
      type.t._0_2_ = VVar4.field_0;
      bVar3 = ValueType::operator==((ValueType *)&type,(ValueType)0x9);
      if (((TVar5 == TypeIds_Array) && (bVar3)) && (bVar3 = DoArrayCheckHoist(this), bVar3)) {
        loop = this->currentBlock->loop;
        if (loop == (Loop *)0x0) {
          bVar3 = ImplicitCallFlagsAllowOpts(this->func);
        }
        else {
          bVar3 = ImplicitCallFlagsAllowOpts(loop);
        }
        if ((bVar3 != false) &&
           ((bVar3 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_32[0].field_0),
            !bVar3 || (bVar3 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0),
                      !bVar3)))) {
          local_34.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::GetObject(Array);
          VVar4 = ValueType::SetArrayTypeId((ValueType *)&local_34.field_0,TypeIds_Array);
          type.t._0_2_ = VVar4.field_0;
        }
      }
      bVar3 = ValueType::operator!=((ValueType *)&type,(ValueType)0x9);
      if (bVar3) {
        ChangeValueType(this,this->currentBlock,value,type.t._0_2_,false,true);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::UpdateObjPtrValueType(IR::Opnd * opnd, IR::Instr * instr)
{
    if (!opnd->IsSymOpnd() || !opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return;
    }

    if (!instr->HasTypeCheckBailOut())
    {
        // No type check bailout, we didn't check that type of the object pointer.
        return;
    }

    // Only check that fixed field should have type check bailout in loop prepass.
    Assert(instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass());

    if (instr->m_opcode != Js::OpCode::CheckFixedFld)
    {
        // DeadStore pass may remove type check bailout, except CheckFixedFld which always needs
        // type check bailout. So we can only change the type for CheckFixedFld.
        // Consider: See if we can expand that in the future.
        return;
    }

    IR::PropertySymOpnd * propertySymOpnd = opnd->AsPropertySymOpnd();
    StackSym * objectSym = propertySymOpnd->GetObjectSym();
    Value * objVal = this->currentBlock->globOptData.FindValue(objectSym);
    if (!objVal)
    {
        return;
    }

    ValueType objValueType = objVal->GetValueInfo()->Type();
    if (objValueType.IsDefinite())
    {
        return;
    }

    ValueInfo *objValueInfo = objVal->GetValueInfo();

    // It is possible for a valueInfo to be not definite and still have a byteCodeConstant as symStore, this is because we conservatively copy valueInfo in prePass
    if (objValueInfo->GetSymStore() && objValueInfo->GetSymStore()->IsStackSym() && objValueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
    {
        return;
    }

    // Verify that the types we're checking for here have been locked so that the type ID's can't be changed
    // without changing the type.
    if (!propertySymOpnd->HasObjectTypeSym())
    {
        return;
    }

    StackSym * typeSym = propertySymOpnd->GetObjectTypeSym();
    Assert(typeSym);
    Value * typeValue = currentBlock->globOptData.FindObjectTypeValue(typeSym);
    if (!typeValue)
    {
        return;
    }
    JsTypeValueInfo * typeValueInfo = typeValue->GetValueInfo()->AsJsType();
    JITTypeHolder type = typeValueInfo->GetJsType();
    if (type != nullptr)
    {
        if (Js::DynamicType::Is(type->GetTypeId()) &&
            !type->GetTypeHandler()->IsLocked())
        {
            return;
        }
    }
    else
    {
        Js::EquivalentTypeSet * typeSet = typeValueInfo->GetJsTypeSet();
        Assert(typeSet);
        for (uint16 i = 0; i < typeSet->GetCount(); i++)
        {
            type = typeSet->GetType(i);
            if (Js::DynamicType::Is(type->GetTypeId()) &&
                !type->GetTypeHandler()->IsLocked())
            {
                return;
            }
        }
    }

    AnalysisAssert(type != nullptr);
    Js::TypeId typeId = type->GetTypeId();

    if (Js::TypedArrayBase::Is(typeId))
    {
        // Type ID does not allow us to distinguish between virtual and non-virtual typed array.
        return;
    }

    // Passing false for useVirtual as we would never have a virtual typed array hitting this code path
    ValueType newValueType = ValueType::FromTypeId(typeId, false);

    if (newValueType == ValueType::Uninitialized)
    {
        switch (typeId)
        {
        default:
            // Can't mark as definite object because it may actually be object-with-array.
            // Consider: a value type that subsumes object, array, and object-with-array.
            break;
        case Js::TypeIds_NativeIntArray:
        case Js::TypeIds_NativeFloatArray:
            // Do not mark these values as definite to protect against array conversion
            break;
        case Js::TypeIds_Array:
            // Because array can change type id, we can only make it definite if we are doing array check hoist
            // so that implicit call will be installed between the array checks.
            if (!DoArrayCheckHoist() ||
                (currentBlock->loop
                ? !this->ImplicitCallFlagsAllowOpts(currentBlock->loop)
                : !this->ImplicitCallFlagsAllowOpts(this->func)))
            {
                break;
            }
            if (objValueType.IsLikelyArrayOrObjectWithArray())
            {
                // If we have likely no missing values before, keep the likely, because, we haven't proven that
                // the array really has no missing values
                if (!objValueType.HasNoMissingValues())
                {
                    newValueType = ValueType::GetObject(ObjectType::Array).SetArrayTypeId(typeId);
                }
            }
            else
            {
                newValueType = ValueType::GetObject(ObjectType::Array).SetArrayTypeId(typeId);
            }
            break;
        }
    }
    if (newValueType != ValueType::Uninitialized)
    {
        ChangeValueType(currentBlock, objVal, newValueType, false, true);
    }
}